

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# c_cvars.cpp
# Opt level: O0

void DestroyCVarsFlagged(DWORD flags)

{
  FBaseCVar *pFVar1;
  FBaseCVar *next;
  FBaseCVar *cvar;
  DWORD flags_local;
  
  next = CVars;
  pFVar1 = next;
  while (next = pFVar1, next != (FBaseCVar *)0x0) {
    pFVar1 = next->m_Next;
    if (((next->Flags & flags) != 0) && (next != (FBaseCVar *)0x0)) {
      (*next->_vptr_FBaseCVar[1])();
    }
  }
  return;
}

Assistant:

void DestroyCVarsFlagged (DWORD flags)
{
	FBaseCVar *cvar = CVars;
	FBaseCVar *next = cvar;

	while(cvar)
	{
		next = cvar->m_Next;

		if(cvar->Flags & flags)
			delete cvar;

		cvar = next;
	}
}